

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O0

void Gia_ManCountTents_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vRoots)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj;
  Vec_Int_t *vRoots_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pGVar2 = Gia_ManObj(p,iObj);
    iVar1 = Gia_ObjIsAnd(pGVar2);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsRo(p,pGVar2);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsPi(p,pGVar2);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcS.c"
                        ,0x10c,"void Gia_ManCountTents_rec(Gia_Man_t *, int, Vec_Int_t *)");
        }
      }
      else {
        pGVar2 = Gia_ObjRoToRi(p,pGVar2);
        iVar1 = Gia_ObjFaninId0p(p,pGVar2);
        Vec_IntPush(vRoots,iVar1);
      }
    }
    else {
      iVar1 = Gia_ObjFaninId0(pGVar2,iObj);
      Gia_ManCountTents_rec(p,iVar1,vRoots);
      iVar1 = Gia_ObjFaninId1(pGVar2,iObj);
      Gia_ManCountTents_rec(p,iVar1,vRoots);
    }
  }
  return;
}

Assistant:

void Gia_ManCountTents_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vRoots )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManCountTents_rec( p, Gia_ObjFaninId0(pObj, iObj), vRoots );
        Gia_ManCountTents_rec( p, Gia_ObjFaninId1(pObj, iObj), vRoots );
    }
    else if ( Gia_ObjIsRo(p, pObj) )
        Vec_IntPush( vRoots, Gia_ObjFaninId0p(p, Gia_ObjRoToRi(p, pObj)) );
    else if ( !Gia_ObjIsPi(p, pObj) )
        assert( 0 );
}